

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_print_mpi
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,mbedtls_mpi *X)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  char local_248 [8];
  char str [512];
  
  if ((((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) &&
      (X != (mbedtls_mpi *)0x0)) &&
     ((ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0 &&
      (level <= debug_threshold)))) {
    sVar2 = mbedtls_mpi_bitlen(X);
    snprintf(local_248,0x200,"value of \'%s\' (%u bits) is:\n",text,sVar2 & 0xffffffff);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_248);
    if (sVar2 == 0) {
      local_248[0] = ' ';
      local_248[1] = '0';
      local_248[2] = 0x30;
      uVar3 = 3;
    }
    else if ((sVar2 + 0x7ffffffff >> 0x22 & 1) == 0) {
      uVar4 = (ulong)((uint)(sVar2 + 0x7ffffffff >> 3) & 0x7fffffff);
      lVar5 = uVar4 * 8;
      uVar6 = 0;
      do {
        snprintf(local_248 + uVar6,0x200 - uVar6," %02x",
                 *(ulong *)((long)X->p + (uVar4 & 0xfffffffffffffff8)) >> ((byte)lVar5 & 0x38) &
                 0xff);
        uVar3 = uVar6 + 3;
        if (0x2f < uVar3) {
          snprintf(local_248 + uVar6 + 3,0x1fd - uVar6,"\n");
          (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_248);
          uVar3 = 0;
        }
        lVar5 = lVar5 + -8;
        bVar1 = 0 < (long)uVar4;
        uVar4 = uVar4 - 1;
        uVar6 = uVar3;
      } while (bVar1);
    }
    else {
      uVar3 = 0;
    }
    if (uVar3 != 0) {
      snprintf(local_248 + uVar3,0x200 - uVar3,"\n");
      (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_248);
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_mpi(const mbedtls_ssl_context *ssl, int level,
                             const char *file, int line,
                             const char *text, const mbedtls_mpi *X)
{
    char str[DEBUG_BUF_SIZE];
    size_t bitlen;
    size_t idx = 0;

    if (NULL == ssl              ||
        NULL == ssl->conf        ||
        NULL == ssl->conf->f_dbg ||
        NULL == X                ||
        level > debug_threshold) {
        return;
    }

    bitlen = mbedtls_mpi_bitlen(X);

    mbedtls_snprintf(str, sizeof(str), "value of '%s' (%u bits) is:\n",
                     text, (unsigned) bitlen);
    debug_send_line(ssl, level, file, line, str);

    if (bitlen == 0) {
        str[0] = ' '; str[1] = '0'; str[2] = '0';
        idx = 3;
    } else {
        int n;
        for (n = (int) ((bitlen - 1) / 8); n >= 0; n--) {
            size_t limb_offset = n / sizeof(mbedtls_mpi_uint);
            size_t offset_in_limb = n % sizeof(mbedtls_mpi_uint);
            unsigned char octet =
                (X->p[limb_offset] >> (offset_in_limb * 8)) & 0xff;
            mbedtls_snprintf(str + idx, sizeof(str) - idx, " %02x", octet);
            idx += 3;
            /* Wrap lines after 16 octets that each take 3 columns */
            if (idx >= 3 * 16) {
                mbedtls_snprintf(str + idx, sizeof(str) - idx, "\n");
                debug_send_line(ssl, level, file, line, str);
                idx = 0;
            }
        }
    }

    if (idx != 0) {
        mbedtls_snprintf(str + idx, sizeof(str) - idx, "\n");
        debug_send_line(ssl, level, file, line, str);
    }
}